

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O0

int LZ4_compress_fast(char *source,char *dest,int inputSize,int maxOutputSize,int acceleration)

{
  int iVar1;
  LZ4_stream_t *ctxPtr;
  LZ4_stream_t ctx;
  int result;
  int acceleration_local;
  int maxOutputSize_local;
  int inputSize_local;
  char *dest_local;
  char *source_local;
  
  ctx.table[0x803]._4_4_ = acceleration;
  result = maxOutputSize;
  acceleration_local = inputSize;
  _maxOutputSize_local = dest;
  dest_local = source;
  iVar1 = LZ4_compress_fast_extState(&ctxPtr,source,dest,inputSize,maxOutputSize,acceleration);
  return iVar1;
}

Assistant:

int LZ4_compress_fast(const char* source, char* dest, int inputSize, int maxOutputSize, int acceleration)
{
    int result;
#if (LZ4_HEAPMODE)
    LZ4_stream_t* ctxPtr = ALLOC(sizeof(LZ4_stream_t));   /* malloc-calloc always properly aligned */
    if (ctxPtr == NULL) return 0;
#else
    LZ4_stream_t ctx;
    LZ4_stream_t* const ctxPtr = &ctx;
#endif
    result = LZ4_compress_fast_extState(ctxPtr, source, dest, inputSize, maxOutputSize, acceleration);

#if (LZ4_HEAPMODE)
    FREEMEM(ctxPtr);
#endif
    return result;
}